

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::ExtensionRangeOptions::ByteSizeLong(ExtensionRangeOptions *this)

{
  size_t sVar1;
  size_t sVar2;
  Rep *pRVar3;
  long lVar4;
  long lVar5;
  
  sVar1 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  lVar5 = (long)(this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  sVar1 = sVar1 + lVar5 * 2;
  pRVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 != (Rep *)0x0) {
    pRVar3 = (Rep *)pRVar3->elements;
  }
  for (lVar4 = 0; lVar5 * 8 != lVar4; lVar4 = lVar4 + 8) {
    sVar2 = internal::WireFormatLite::MessageSize<google::protobuf::UninterpretedOption>
                      (*(UninterpretedOption **)((long)pRVar3->elements + lVar4 + -8));
    sVar1 = sVar1 + sVar2;
  }
  sVar1 = Message::MaybeComputeUnknownFieldsSize(&this->super_Message,sVar1,&this->_cached_size_);
  return sVar1;
}

Assistant:

size_t ExtensionRangeOptions::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.ExtensionRangeOptions)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2UL * this->_internal_uninterpreted_option_size();
  for (const auto& msg : this->uninterpreted_option_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}